

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsignal.h
# Opt level: O3

void __thiscall
lsignal::signal<void_(int)>::delete_deffered_internal(signal<void_(int)> *this,internal_data *data)

{
  _List_node_base *p_Var1;
  iterator __position;
  list<lsignal::signal<void_(int)>::joint,_std::allocator<lsignal::signal<void_(int)>::joint>_>
  *this_00;
  
  this_00 = &data->_callbacks;
  __position._M_node =
       (_List_node_base *)
       std::
       __remove_if<std::_List_iterator<lsignal::signal<void(int)>::joint>,__gnu_cxx::__ops::_Iter_pred<lsignal::signal<void(int)>::delete_deffered_internal(lsignal::signal<void(int)>::internal_data*)const::_lambda(lsignal::signal<void(int)>::joint_const&)_1_>>
                 ((data->_callbacks).
                  super__List_base<lsignal::signal<void_(int)>::joint,_std::allocator<lsignal::signal<void_(int)>::joint>_>
                  ._M_impl._M_node.super__List_node_base._M_next,this_00);
  while (__position._M_node != (_List_node_base *)this_00) {
    p_Var1 = (__position._M_node)->_M_next;
    std::__cxx11::
    list<lsignal::signal<void_(int)>::joint,_std::allocator<lsignal::signal<void_(int)>::joint>_>::
    _M_erase(this_00,__position);
    __position._M_node = p_Var1;
  }
  return;
}

Assistant:

void signal<R(Args...)>::delete_deffered_internal(internal_data* data) const
	{
		auto it_to_remove = std::remove_if(data->_callbacks.begin(), data->_callbacks.end(),
			[](const joint& jnt) { return jnt.connection->deleted; }
			);

		data->_callbacks.erase(it_to_remove, data->_callbacks.end());
	}